

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
__thiscall pstore::broker::parse(broker *this,message_type *msg,partial_cmds *cmds)

{
  byte *pbVar1;
  pointer *ppuVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  string *psVar8;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
  __it;
  long *plVar9;
  long *plVar10;
  part_number_too_large *this_00;
  runtime_error *this_01;
  long lVar11;
  long *plVar12;
  long lVar13;
  long lVar14;
  payload_type *ppVar15;
  byte *pbVar16;
  ulong uVar17;
  byte *pbVar18;
  byte *pbVar19;
  _Head_base<0UL,_pstore::broker::broker_command_*,_false> _Var20;
  byte *pbVar21;
  pair<std::__detail::_Node_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_false,_true>,_bool>
  pVar22;
  string complete_command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  __uniq_ptr_impl<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
  local_e8;
  _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_e0;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  pointer *local_b8;
  long local_b0;
  pointer local_a8;
  pointer puStack_a0;
  byte *local_98;
  long local_90;
  byte local_88;
  undefined7 uStack_87;
  key_type local_78;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vStack_68;
  undefined8 local_50;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_48;
  
  local_e8._M_t.
  super__Tuple_impl<0UL,_pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
  .super__Head_base<0UL,_pstore::broker::broker_command_*,_false>._M_head_impl =
       (tuple<pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
        )(tuple<pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
          )this;
  local_e0 = &cmds->_M_h;
  if (msg->num_parts <= msg->part_no) {
    this_00 = (part_number_too_large *)__cxa_allocate_exception(0x10);
    part_number_too_large::part_number_too_large(this_00);
    __cxa_throw(this_00,&part_number_too_large::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar6 = std::chrono::_V2::system_clock::now();
  lVar7 = 0x100;
  lVar11 = 0xff;
  lVar13 = 0xfe;
  lVar14 = 0xfd;
  uVar17 = 0x3e;
  do {
    if ((msg->payload)._M_elems[lVar11 + -0xc] != '\0') {
      ppVar15 = (payload_type *)((msg->payload)._M_elems + lVar7 + -0xc);
      break;
    }
    if ((msg->payload)._M_elems[lVar11 + -0xd] != '\0') {
      ppVar15 = (payload_type *)((msg->payload)._M_elems + lVar11 + -0xc);
      break;
    }
    if ((msg->payload)._M_elems[lVar11 + -0xe] != '\0') {
      ppVar15 = (payload_type *)((msg->payload)._M_elems + lVar13 + -0xc);
      break;
    }
    if ((msg->payload)._M_elems[lVar11 + -0xf] != '\0') {
      ppVar15 = (payload_type *)((msg->payload)._M_elems + lVar14 + -0xc);
      break;
    }
    lVar7 = lVar7 + -4;
    lVar11 = lVar11 + -4;
    lVar13 = lVar13 + -4;
    lVar14 = lVar14 + -4;
    uVar17 = uVar17 - 1;
    ppVar15 = &msg->payload;
  } while (1 < uVar17);
  psVar8 = (string *)operator_new(0x20);
  *(string **)psVar8 = psVar8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar8,&msg->payload,ppVar15);
  local_78.first = (unsigned_long)msg->sender_id;
  uVar17._0_4_ = msg->sender_id;
  uVar17._4_4_ = msg->message_id;
  local_78.second = (unsigned_long)msg->message_id;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar8;
  __it._M_cur = (__node_type *)
                std::
                _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_e0,&local_78);
  if (__it._M_cur == (__node_type *)0x0) {
    local_50 = 0;
    local_78.second = 0;
    vStack_68.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_68.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_68.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.first = uVar17;
    pVar22 = std::
             _Hashtable<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_long,unsigned_long>>,std::hash<std::pair<unsigned_long,unsigned_long>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
             ::_M_emplace<std::pair<std::pair<unsigned_int,unsigned_int>,pstore::broker::pieces>>
                       ((_Hashtable<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_long,unsigned_long>>,std::hash<std::pair<unsigned_long,unsigned_long>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         *)local_e0,&local_78);
    __it._M_cur = (__node_type *)
                  pVar22.first.
                  super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                  ._M_cur;
    std::
    vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector(&vStack_68);
    std::
    vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector(&local_48);
    std::
    vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::resize((vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)((long)__it._M_cur + 0x20),(ulong)msg->num_parts);
  }
  pbVar4 = local_f0;
  *(undefined8 *)
   ((long)&((__it._M_cur)->
           super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
           ._M_storage._M_storage + 0x10) = uVar6;
  lVar7 = *(long *)((long)&((__it._M_cur)->
                           super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
                           ._M_storage._M_storage + 0x18);
  if (*(long *)((long)&((__it._M_cur)->
                       super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
                       ._M_storage._M_storage + 0x20) - lVar7 >> 3 != (ulong)msg->num_parts) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"total number of parts mismatch");
    *(undefined ***)this_01 = &PTR__runtime_error_00158f58;
    __cxa_throw(this_01,&number_of_parts_mismatch::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar17 = (ulong)msg->part_no;
  lVar11 = *(long *)(lVar7 + uVar17 * 8);
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __ptr = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           (lVar7 + uVar17 * 8);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar7 + uVar17 * 8) =
       pbVar4;
  if (__ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(lVar7 + uVar17 * 8),__ptr);
  }
  if (lVar11 != 0) {
LAB_0011d4f6:
    *(undefined8 *)
     local_e8._M_t.
     super__Tuple_impl<0UL,_pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
     .super__Head_base<0UL,_pstore::broker::broker_command_*,_false>._M_head_impl = 0;
    _Var20._M_head_impl =
         (broker_command *)
         local_e8._M_t.
         super__Tuple_impl<0UL,_pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
         .super__Head_base<0UL,_pstore::broker::broker_command_*,_false>._M_head_impl;
    goto LAB_0011d502;
  }
  plVar10 = *(long **)((long)&((__it._M_cur)->
                              super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
                              ._M_storage._M_storage + 0x18);
  plVar3 = *(long **)((long)&((__it._M_cur)->
                             super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
                             ._M_storage._M_storage + 0x20);
  uVar17 = (long)plVar3 - (long)plVar10;
  plVar9 = plVar10;
  if (0 < (long)uVar17 >> 5) {
    plVar9 = (long *)((uVar17 & 0xffffffffffffffe0) + (long)plVar10);
    lVar7 = ((long)uVar17 >> 5) + 1;
    plVar12 = plVar10 + 2;
    do {
      if (plVar12[-2] == 0) {
        plVar12 = plVar12 + -2;
        goto LAB_0011d4f1;
      }
      if (plVar12[-1] == 0) {
        plVar12 = plVar12 + -1;
        goto LAB_0011d4f1;
      }
      if (*plVar12 == 0) goto LAB_0011d4f1;
      if (plVar12[1] == 0) {
        plVar12 = plVar12 + 1;
        goto LAB_0011d4f1;
      }
      lVar7 = lVar7 + -1;
      plVar12 = plVar12 + 4;
    } while (1 < lVar7);
    uVar17 = (long)plVar3 - (long)plVar9;
  }
  lVar7 = (long)uVar17 >> 3;
  if (lVar7 == 1) {
LAB_0011d4d4:
    plVar12 = plVar9;
    if (*plVar9 != 0) {
      plVar12 = plVar3;
    }
LAB_0011d4f1:
    if (plVar12 != plVar3) goto LAB_0011d4f6;
  }
  else {
    if (lVar7 == 2) {
LAB_0011d4ca:
      plVar12 = plVar9;
      if (*plVar9 != 0) {
        plVar9 = plVar9 + 1;
        goto LAB_0011d4d4;
      }
      goto LAB_0011d4f1;
    }
    if (lVar7 == 3) {
      plVar12 = plVar9;
      if (*plVar9 != 0) {
        plVar9 = plVar9 + 1;
        goto LAB_0011d4ca;
      }
      goto LAB_0011d4f1;
    }
  }
  local_90 = 0;
  local_88 = 0;
  local_98 = &local_88;
  if (plVar10 != plVar3) {
    do {
      if ((ulong *)*plVar10 == (ulong *)0x0) {
        assert_failed("c.get () != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/parser.cpp"
                      ,0x67);
      }
      std::__cxx11::string::_M_append((char *)&local_98,*(ulong *)*plVar10);
      plVar10 = plVar10 + 1;
    } while (plVar10 != plVar3);
  }
  std::
  _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::erase(local_e0,(const_iterator)__it._M_cur);
  pbVar21 = local_98;
  pbVar1 = local_98 + local_90;
  if (local_90 != 0) {
    iVar5 = isspace((uint)*local_98);
    pbVar21 = pbVar21 + (iVar5 != 0);
  }
  lVar7 = (long)pbVar1 - (long)pbVar21 >> 2;
  pbVar16 = pbVar21;
  if (0 < lVar7) {
    pbVar16 = pbVar21 + ((long)pbVar1 - (long)pbVar21 & 0xfffffffffffffffc);
    lVar7 = lVar7 + 1;
    pbVar18 = pbVar21 + 3;
    do {
      iVar5 = isspace((uint)pbVar18[-3]);
      if (iVar5 != 0) {
        pbVar18 = pbVar18 + -3;
        goto LAB_0011d674;
      }
      iVar5 = isspace((uint)pbVar18[-2]);
      if (iVar5 != 0) {
        pbVar18 = pbVar18 + -2;
        goto LAB_0011d674;
      }
      iVar5 = isspace((uint)pbVar18[-1]);
      if (iVar5 != 0) {
        pbVar18 = pbVar18 + -1;
        goto LAB_0011d674;
      }
      iVar5 = isspace((uint)*pbVar18);
      if (iVar5 != 0) goto LAB_0011d674;
      lVar7 = lVar7 + -1;
      pbVar18 = pbVar18 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)pbVar1 - (long)pbVar16;
  if (lVar7 == 1) {
LAB_0011d651:
    iVar5 = isspace((uint)*pbVar16);
    pbVar18 = pbVar16;
    if (iVar5 == 0) {
      pbVar18 = pbVar1;
    }
LAB_0011d674:
    pbVar19 = pbVar18;
    if (pbVar18 != pbVar1) {
      iVar5 = isspace((uint)*pbVar18);
      pbVar19 = pbVar18 + (iVar5 != 0);
    }
  }
  else {
    if (lVar7 == 2) {
LAB_0011d641:
      iVar5 = isspace((uint)*pbVar16);
      pbVar18 = pbVar16;
      if (iVar5 == 0) {
        pbVar16 = pbVar16 + 1;
        goto LAB_0011d651;
      }
      goto LAB_0011d674;
    }
    pbVar18 = pbVar1;
    pbVar19 = pbVar1;
    if (lVar7 == 3) {
      iVar5 = isspace((uint)*pbVar16);
      pbVar18 = pbVar16;
      if (iVar5 == 0) {
        pbVar16 = pbVar16 + 1;
        goto LAB_0011d641;
      }
      goto LAB_0011d674;
    }
  }
  local_d8 = (vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_c8;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_d8,pbVar21,pbVar18);
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_b8,pbVar19,pbVar1);
  plVar10 = (long *)operator_new(0x40);
  lVar7 = local_d0;
  _Var20._M_head_impl = (broker_command *)local_e8;
  if (local_d8 ==
      (vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       *)local_c8) {
    vStack_68.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8._8_8_;
    local_d8 = &vStack_68;
  }
  vStack_68.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT71(local_c8._1_7_,local_c8[0]);
  local_d0 = 0;
  local_c8[0] = 0;
  ppuVar2 = &local_48.
             super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_b8 == &local_a8) {
    local_48.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puStack_a0;
    local_b8 = ppuVar2;
  }
  local_48.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_a8;
  *plVar10 = (long)(plVar10 + 2);
  if (local_d8 == &vStack_68) {
    plVar10[2] = (long)vStack_68.
                       super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    plVar10[3] = (long)vStack_68.
                       super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *plVar10 = (long)local_d8;
    plVar10[2] = (long)vStack_68.
                       super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  }
  plVar10[1] = lVar7;
  plVar10[4] = (long)(plVar10 + 6);
  if (local_b8 == ppuVar2) {
    plVar10[6] = (long)local_a8;
    plVar10[7] = (long)local_48.
                       super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    plVar10[4] = (long)local_b8;
    plVar10[6] = (long)local_a8;
  }
  plVar10[5] = local_b0;
  *(long **)local_e8._M_t.
            super__Tuple_impl<0UL,_pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
            .super__Head_base<0UL,_pstore::broker::broker_command_*,_false>._M_head_impl = plVar10;
  local_d8 = (vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_c8;
  local_b8 = &local_a8;
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
LAB_0011d502:
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  return (__uniq_ptr_data<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>,_true,_true>
          )(tuple<pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
            )_Var20._M_head_impl;
}

Assistant:

std::unique_ptr<broker_command> parse (brokerface::message_type const & msg,
                                               partial_cmds & cmds) {

            if (msg.part_no >= msg.num_parts) {
                throw part_number_too_large ();
            }

            auto const now = std::chrono::system_clock::now ();

            auto payload = extract_payload (msg);

            auto const key = std::make_pair (msg.sender_id, msg.message_id);
            auto it = cmds.find (key);
            if (it == std::end (cmds)) {
                it = cmds.insert (std::make_pair (key, pieces{})).first;
                it->second.s_.resize (msg.num_parts);
            }

            // Record the arrival time of this newest message of the set.
            it->second.arrive_time_ = now;
            auto & value = it->second.s_;
            if (value.size () != msg.num_parts) {
                throw number_of_parts_mismatch ();
            }

            bool const was_missing = value[msg.part_no].get () == nullptr;
            value[msg.part_no] = std::move (payload);

            if (was_missing) {
                auto not_null = [] (std::unique_ptr<std::string> const & str) {
                    return str != nullptr;
                };
                if (std::all_of (std::begin (value), std::end (value), not_null)) {
                    std::string complete_command;
                    for (auto const & c : value) {
                        PSTORE_ASSERT (c.get () != nullptr);
                        complete_command += *c;
                    }

                    cmds.erase (it);

                    auto end = std::end (complete_command);
                    auto const verb_parts = extract_word (std::begin (complete_command), end);
                    auto const path_parts = std::make_pair (skip_ws (verb_parts.second, end), end);
                    return std::make_unique<broker_command> (substr (verb_parts),
                                                             substr (path_parts));
                }
            }

            return nullptr;
        }